

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O2

int BN_lshift(BIGNUM *r,BIGNUM *a,int n)

{
  ulong *puVar1;
  ulong *__s;
  ulong uVar2;
  sbyte sVar3;
  BIGNUM *pBVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  iVar5 = 0;
  if (-1 < n) {
    r->neg = a->neg;
    uVar7 = (uint)n >> 6;
    pBVar4 = bn_wexpand((BIGNUM *)r,a->top + uVar7 + 1);
    if (pBVar4 != (BIGNUM *)0x0) {
      puVar1 = a->d;
      __s = r->d;
      uVar6 = (ulong)(uint)a->top;
      __s[(int)(a->top + uVar7)] = 0;
      if ((n & 0x3fU) == 0) {
        while (iVar5 = (int)uVar6, 0 < iVar5) {
          uVar6 = uVar6 - 1;
          __s[iVar5 + (uVar7 - 1)] = puVar1[uVar6 & 0xffffffff];
        }
      }
      else {
        sVar3 = (sbyte)(n & 0x3fU);
        while (0 < (int)uVar6) {
          uVar2 = puVar1[uVar6 - 1 & 0xffffffff];
          __s[uVar7 + uVar6] = __s[uVar7 + uVar6] | uVar2 >> (0x40U - sVar3 & 0x3f);
          __s[(uVar7 - 1) + (int)uVar6] = uVar2 << sVar3;
          uVar6 = uVar6 - 1;
        }
      }
      memset(__s,0,(ulong)(uVar7 << 3));
      r->top = uVar7 + 1 + a->top;
      bn_correct_top((BIGNUM *)r);
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int BN_lshift(BIGNUM *r, const BIGNUM *a, int n)
{
    int i, nw, lb, rb;
    BN_ULONG *t, *f;
    BN_ULONG l;

    bn_check_top(r);
    bn_check_top(a);

    if (n < 0) {
        //BNerr(BN_F_BN_LSHIFT, BN_R_INVALID_SHIFT);
        return 0;
    }

    r->neg = a->neg;
    nw = n / BN_BITS2;
    if (bn_wexpand(r, a->top + nw + 1) == NULL)
        return (0);
    lb = n % BN_BITS2;
    rb = BN_BITS2 - lb;
    f = a->d;
    t = r->d;
    t[a->top + nw] = 0;
    if (lb == 0)
        for (i = a->top - 1; i >= 0; i--)
            t[nw + i] = f[i];
    else
        for (i = a->top - 1; i >= 0; i--) {
            l = f[i];
            t[nw + i + 1] |= (l >> rb) & BN_MASK2;
            t[nw + i] = (l << lb) & BN_MASK2;
        }
    memset(t, 0, sizeof(*t) * nw);
    r->top = a->top + nw + 1;
    bn_correct_top(r);
    bn_check_top(r);
    return (1);
}